

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O2

void Ptex::v2_2::anon_unknown_4::ApplyN<float>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  float *val;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  float *val_00;
  long lVar9;
  undefined8 uStack_70;
  float *local_68;
  float *local_60;
  float *local_58;
  PtexSeparableKernel *local_50;
  long local_48;
  float *local_40;
  VecMultN<float> local_37;
  VecAccumN<float> local_36;
  VecAccumN<float> local_35;
  int local_34;
  
  lVar4 = -((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  local_40 = (float *)((long)&local_68 + lVar4);
  bVar2 = (k->res).ulog2;
  iVar3 = k->uw;
  pfVar7 = k->kv;
  val_00 = (float *)((long)data + (long)(((k->v << (bVar2 & 0x1f)) + k->u) * nTxChan) * 4);
  local_48 = (long)(nTxChan << (bVar2 & 0x1f));
  local_60 = val_00 + k->vw * local_48;
  local_48 = local_48 << 2;
  local_58 = result;
  local_50 = k;
  local_34 = nChan;
  for (; iVar6 = local_34, pfVar5 = local_40, val_00 != local_60;
      val_00 = (float *)((long)val_00 + local_48)) {
    pfVar8 = local_50->ku;
    fVar1 = *pfVar8;
    local_68 = pfVar7;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x510e0a;
    PtexUtils::VecMultN<float>::operator()(&local_37,pfVar5,val_00,iVar6,fVar1);
    for (lVar9 = (long)nTxChan * 4; iVar6 = local_34, val = local_40, pfVar5 = local_58,
        pfVar8 = pfVar8 + 1, (long)(iVar3 * nTxChan) * 4 != lVar9; lVar9 = lVar9 + (long)nTxChan * 4
        ) {
      fVar1 = *pfVar8;
      *(undefined8 *)((long)&uStack_70 + lVar4) = 0x510e2e;
      PtexUtils::VecAccumN<float>::operator()
                (&local_36,val,(float *)(lVar9 + (long)val_00),iVar6,fVar1);
    }
    fVar1 = *local_68;
    pfVar7 = local_68 + 1;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x510e57;
    PtexUtils::VecAccumN<float>::operator()(&local_35,pfVar5,val,iVar6,fVar1);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }